

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O0

void transpose_8bit_8x8(__m128i *in,__m128i *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i c0;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  c1[1]._0_1_ = (undefined1)uVar1;
  c1[1]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  c1[1]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  c1[1]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  c1[1]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  c1[1]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  c1[1]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  c1[1]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  c2[1]._0_1_ = (undefined1)uVar2;
  c2[1]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  c2[1]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  c2[1]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  c2[1]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  c2[1]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  c2[1]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  c2[1]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[4];
  uVar2 = in_RDI[6];
  c3[1]._0_1_ = (undefined1)uVar1;
  c3[1]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  c3[1]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  c3[1]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  c3[1]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  c3[1]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  c3[1]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  c3[1]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_88 = (undefined1)uVar2;
  uStack_87 = (undefined1)((ulong)uVar2 >> 8);
  uStack_86 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_85 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_84 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_83 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_82 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_81 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[8];
  uVar2 = in_RDI[10];
  local_98 = (undefined1)uVar1;
  uStack_97 = (undefined1)((ulong)uVar1 >> 8);
  uStack_96 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_95 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_94 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_93 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_92 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_91 = (undefined1)((ulong)uVar1 >> 0x38);
  local_a8 = (undefined1)uVar2;
  uStack_a7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_a6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_a5 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_a4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_a3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_a2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_a1 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0xc];
  uVar2 = in_RDI[0xe];
  local_b8 = (undefined1)uVar1;
  uStack_b7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_b6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_b5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_b4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_b3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_b2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_b1 = (undefined1)((ulong)uVar1 >> 0x38);
  local_c8 = (undefined1)uVar2;
  uStack_c7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_c6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_c5 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_c4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_c3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_c2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_c1 = (undefined1)((ulong)uVar2 >> 0x38);
  *in_RSI = (undefined1)c1[1];
  in_RSI[1] = (undefined1)c2[1];
  in_RSI[2] = (undefined1)c3[1];
  in_RSI[3] = uStack_88;
  in_RSI[4] = local_98;
  in_RSI[5] = local_a8;
  in_RSI[6] = local_b8;
  in_RSI[7] = local_c8;
  in_RSI[8] = (undefined1)c1[1];
  in_RSI[9] = (undefined1)c2[1];
  in_RSI[10] = (undefined1)c3[1];
  in_RSI[0xb] = uStack_88;
  in_RSI[0xc] = local_98;
  in_RSI[0xd] = local_a8;
  in_RSI[0xe] = local_b8;
  in_RSI[0xf] = local_c8;
  in_RSI[0x10] = c1[1]._1_1_;
  in_RSI[0x11] = c2[1]._1_1_;
  in_RSI[0x12] = c3[1]._1_1_;
  in_RSI[0x13] = uStack_87;
  in_RSI[0x14] = uStack_97;
  in_RSI[0x15] = uStack_a7;
  in_RSI[0x16] = uStack_b7;
  in_RSI[0x17] = uStack_c7;
  in_RSI[0x18] = c1[1]._1_1_;
  in_RSI[0x19] = c2[1]._1_1_;
  in_RSI[0x1a] = c3[1]._1_1_;
  in_RSI[0x1b] = uStack_87;
  in_RSI[0x1c] = uStack_97;
  in_RSI[0x1d] = uStack_a7;
  in_RSI[0x1e] = uStack_b7;
  in_RSI[0x1f] = uStack_c7;
  in_RSI[0x20] = c1[1]._2_1_;
  in_RSI[0x21] = c2[1]._2_1_;
  in_RSI[0x22] = c3[1]._2_1_;
  in_RSI[0x23] = uStack_86;
  in_RSI[0x24] = uStack_96;
  in_RSI[0x25] = uStack_a6;
  in_RSI[0x26] = uStack_b6;
  in_RSI[0x27] = uStack_c6;
  in_RSI[0x28] = c1[1]._2_1_;
  in_RSI[0x29] = c2[1]._2_1_;
  in_RSI[0x2a] = c3[1]._2_1_;
  in_RSI[0x2b] = uStack_86;
  in_RSI[0x2c] = uStack_96;
  in_RSI[0x2d] = uStack_a6;
  in_RSI[0x2e] = uStack_b6;
  in_RSI[0x2f] = uStack_c6;
  in_RSI[0x30] = c1[1]._3_1_;
  in_RSI[0x31] = c2[1]._3_1_;
  in_RSI[0x32] = c3[1]._3_1_;
  in_RSI[0x33] = uStack_85;
  in_RSI[0x34] = uStack_95;
  in_RSI[0x35] = uStack_a5;
  in_RSI[0x36] = uStack_b5;
  in_RSI[0x37] = uStack_c5;
  in_RSI[0x38] = c1[1]._3_1_;
  in_RSI[0x39] = c2[1]._3_1_;
  in_RSI[0x3a] = c3[1]._3_1_;
  in_RSI[0x3b] = uStack_85;
  in_RSI[0x3c] = uStack_95;
  in_RSI[0x3d] = uStack_a5;
  in_RSI[0x3e] = uStack_b5;
  in_RSI[0x3f] = uStack_c5;
  in_RSI[0x40] = c1[1]._4_1_;
  in_RSI[0x41] = c2[1]._4_1_;
  in_RSI[0x42] = c3[1]._4_1_;
  in_RSI[0x43] = uStack_84;
  in_RSI[0x44] = uStack_94;
  in_RSI[0x45] = uStack_a4;
  in_RSI[0x46] = uStack_b4;
  in_RSI[0x47] = uStack_c4;
  in_RSI[0x48] = c1[1]._4_1_;
  in_RSI[0x49] = c2[1]._4_1_;
  in_RSI[0x4a] = c3[1]._4_1_;
  in_RSI[0x4b] = uStack_84;
  in_RSI[0x4c] = uStack_94;
  in_RSI[0x4d] = uStack_a4;
  in_RSI[0x4e] = uStack_b4;
  in_RSI[0x4f] = uStack_c4;
  in_RSI[0x50] = c1[1]._5_1_;
  in_RSI[0x51] = c2[1]._5_1_;
  in_RSI[0x52] = c3[1]._5_1_;
  in_RSI[0x53] = uStack_83;
  in_RSI[0x54] = uStack_93;
  in_RSI[0x55] = uStack_a3;
  in_RSI[0x56] = uStack_b3;
  in_RSI[0x57] = uStack_c3;
  in_RSI[0x58] = c1[1]._5_1_;
  in_RSI[0x59] = c2[1]._5_1_;
  in_RSI[0x5a] = c3[1]._5_1_;
  in_RSI[0x5b] = uStack_83;
  in_RSI[0x5c] = uStack_93;
  in_RSI[0x5d] = uStack_a3;
  in_RSI[0x5e] = uStack_b3;
  in_RSI[0x5f] = uStack_c3;
  in_RSI[0x60] = c1[1]._6_1_;
  in_RSI[0x61] = c2[1]._6_1_;
  in_RSI[0x62] = c3[1]._6_1_;
  in_RSI[99] = uStack_82;
  in_RSI[100] = uStack_92;
  in_RSI[0x65] = uStack_a2;
  in_RSI[0x66] = uStack_b2;
  in_RSI[0x67] = uStack_c2;
  in_RSI[0x68] = c1[1]._6_1_;
  in_RSI[0x69] = c2[1]._6_1_;
  in_RSI[0x6a] = c3[1]._6_1_;
  in_RSI[0x6b] = uStack_82;
  in_RSI[0x6c] = uStack_92;
  in_RSI[0x6d] = uStack_a2;
  in_RSI[0x6e] = uStack_b2;
  in_RSI[0x6f] = uStack_c2;
  in_RSI[0x70] = c1[1]._7_1_;
  in_RSI[0x71] = c2[1]._7_1_;
  in_RSI[0x72] = c3[1]._7_1_;
  in_RSI[0x73] = uStack_81;
  in_RSI[0x74] = uStack_91;
  in_RSI[0x75] = uStack_a1;
  in_RSI[0x76] = uStack_b1;
  in_RSI[0x77] = uStack_c1;
  in_RSI[0x78] = c1[1]._7_1_;
  in_RSI[0x79] = c2[1]._7_1_;
  in_RSI[0x7a] = c3[1]._7_1_;
  in_RSI[0x7b] = uStack_81;
  in_RSI[0x7c] = uStack_91;
  in_RSI[0x7d] = uStack_a1;
  in_RSI[0x7e] = uStack_b1;
  in_RSI[0x7f] = uStack_c1;
  return;
}

Assistant:

static inline void transpose_8bit_8x8(const __m128i *const in,
                                      __m128i *const out) {
  // Unpack 8 bit elements. Goes from:
  // in[0]: 00 01 02 03 04 05 06 07
  // in[1]: 10 11 12 13 14 15 16 17
  // in[2]: 20 21 22 23 24 25 26 27
  // in[3]: 30 31 32 33 34 35 36 37
  // in[4]: 40 41 42 43 44 45 46 47
  // in[5]: 50 51 52 53 54 55 56 57
  // in[6]: 60 61 62 63 64 65 66 67
  // in[7]: 70 71 72 73 74 75 76 77
  // to:
  // a0:    00 10 01 11 02 12 03 13  04 14 05 15 06 16 07 17
  // a1:    20 30 21 31 22 32 23 33  24 34 25 35 26 36 27 37
  // a2:    40 50 41 51 42 52 43 53  44 54 45 55 46 56 47 57
  // a3:    60 70 61 71 62 72 63 73  64 74 65 75 66 76 67 77
  const __m128i a0 = _mm_unpacklo_epi8(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi8(in[2], in[3]);
  const __m128i a2 = _mm_unpacklo_epi8(in[4], in[5]);
  const __m128i a3 = _mm_unpacklo_epi8(in[6], in[7]);

  // Unpack 16 bit elements resulting in:
  // b0: 00 10 20 30 01 11 21 31  02 12 22 32 03 13 23 33
  // b1: 40 50 60 70 41 51 61 71  42 52 62 72 43 53 63 73
  // b2: 04 14 24 34 05 15 25 35  06 16 26 36 07 17 27 37
  // b3: 44 54 64 74 45 55 65 75  46 56 66 76 47 57 67 77
  const __m128i b0 = _mm_unpacklo_epi16(a0, a1);
  const __m128i b1 = _mm_unpackhi_epi16(a0, a1);
  const __m128i b2 = _mm_unpacklo_epi16(a2, a3);
  const __m128i b3 = _mm_unpackhi_epi16(a2, a3);

  // Unpack 32 bit elements resulting in:
  // c0: 00 10 20 30 40 50 60 70  01 11 21 31 41 51 61 71
  // c1: 02 12 22 32 42 52 62 72  03 13 23 33 43 53 63 73
  // c2: 04 14 24 34 44 54 64 74  05 15 25 35 45 55 65 75
  // c3: 06 16 26 36 46 56 66 76  07 17 27 37 47 57 67 77
  const __m128i c0 = _mm_unpacklo_epi32(b0, b2);
  const __m128i c1 = _mm_unpackhi_epi32(b0, b2);
  const __m128i c2 = _mm_unpacklo_epi32(b1, b3);
  const __m128i c3 = _mm_unpackhi_epi32(b1, b3);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30 40 50 60 70
  // out[1]: 01 11 21 31 41 51 61 71
  // out[2]: 02 12 22 32 42 52 62 72
  // out[3]: 03 13 23 33 43 53 63 73
  // out[4]: 04 14 24 34 44 54 64 74
  // out[5]: 05 15 25 35 45 55 65 75
  // out[6]: 06 16 26 36 46 56 66 76
  // out[7]: 07 17 27 37 47 57 67 77
  out[0] = _mm_unpacklo_epi64(c0, c0);
  out[1] = _mm_unpackhi_epi64(c0, c0);
  out[2] = _mm_unpacklo_epi64(c1, c1);
  out[3] = _mm_unpackhi_epi64(c1, c1);
  out[4] = _mm_unpacklo_epi64(c2, c2);
  out[5] = _mm_unpackhi_epi64(c2, c2);
  out[6] = _mm_unpacklo_epi64(c3, c3);
  out[7] = _mm_unpackhi_epi64(c3, c3);
}